

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetWindowResizeBorderID(ImGuiWindow *window,ImGuiDir dir)

{
  ImGuiID IVar1;
  int in_ESI;
  long in_RDI;
  ImGuiID id;
  int n;
  int local_10 [4];
  
  local_10[0] = in_ESI + 4;
  IVar1 = ImHashStr("#RESIZE",0,*(ImU32 *)(in_RDI + 8));
  IVar1 = ImHashData(local_10,4,IVar1);
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetWindowResizeBorderID(ImGuiWindow* window, ImGuiDir dir)
{
    IM_ASSERT(dir >= 0 && dir < 4);
    int n = (int)dir + 4;
    ImGuiID id = window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}